

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

pool_ptr<soul::AST::Expression> __thiscall
soul::StructuralParser::parseDelayLength(StructuralParser *this)

{
  bool bVar1;
  Expression *o;
  StructuralParser *in_RSI;
  Expression *e;
  StructuralParser *this_local;
  
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&in_RSI->super_SOULTokeniser,(TokenType)0x575e01);
  if (bVar1) {
    o = parseExpression(in_RSI,false);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&in_RSI->super_SOULTokeniser,(TokenType)0x54ace4);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&in_RSI->super_SOULTokeniser,(TokenType)0x54e748);
    pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
              ((pool_ptr<soul::AST::Expression> *)this,o);
  }
  else {
    pool_ptr<soul::AST::Expression>::pool_ptr((pool_ptr<soul::AST::Expression> *)this);
  }
  return (pool_ptr<soul::AST::Expression>)(Expression *)this;
}

Assistant:

pool_ptr<AST::Expression> parseDelayLength()
    {
        if (matchIf (Operator::openBracket))
        {
            auto& e = parseExpression();
            expect (Operator::closeBracket);
            expect (Operator::rightArrow);
            return e;
        }

        return {};
    }